

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getDataRange_uvec3
          (vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,GLAttributeBuffer *this,size_t start,size_t count)

{
  allocator local_49;
  string local_48;
  
  if ((this->super_AttributeBuffer).dataType != Vector3UInt) {
    std::__cxx11::string::string((string *)&local_48,"bad getData type",&local_49);
    exception(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  getDataRange_helper<glm::vec<3,unsigned_int,(glm::qualifier)0>>
            (__return_storage_ptr__,this,start,count);
  return __return_storage_ptr__;
}

Assistant:

std::vector<glm::uvec3> GLAttributeBuffer::getDataRange_uvec3(size_t start, size_t count) {
  if (getType() != RenderDataType::Vector3UInt) exception("bad getData type");
  return getDataRange_helper<glm::uvec3>(start, count);
}